

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O1

void PWM_Init(void *info)

{
  *(undefined1 *)((long)info + 0xc) = 0;
  *(undefined4 *)((long)info + 0xe) = 0;
  *(undefined4 *)((long)info + 8) = 0x10100fff;
  *(undefined8 *)((long)info + 0x14) = 0xfff00000800;
  return;
}

Assistant:

static void PWM_Init(void* info)
{
	pwm_chip* chip = (pwm_chip*)info;
	
	chip->PWM_Mode = 0;
	chip->PWM_Out_R = 0;
	chip->PWM_Out_L = 0;
	
	//PWM_Loudness = 0;
	PWM_Set_Cycle(chip, 0);
	PWM_Set_Int(chip, 0);
}